

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_setup_connection(Curl_easy *data,connectdata *conn)

{
  char cVar1;
  FTP *pFVar2;
  uint uVar3;
  char *pcVar4;
  
  pFVar2 = (FTP *)(*Curl_ccalloc)(0x20,1);
  (data->req).p.ftp = pFVar2;
  if (pFVar2 != (FTP *)0x0) {
    pcVar4 = (data->state).up.path + 1;
    pFVar2->path = pcVar4;
    pcVar4 = strstr(pcVar4,";type=");
    if ((pcVar4 != (char *)0x0) ||
       (pcVar4 = strstr((conn->host).rawalloc,";type="), pcVar4 != (char *)0x0)) {
      *pcVar4 = '\0';
      cVar1 = Curl_raw_toupper(pcVar4[6]);
      uVar3 = *(uint *)&(data->state).field_0x6d0;
      if (cVar1 == 'D') {
        uVar3 = uVar3 | 0x10000;
      }
      else if (cVar1 == 'A') {
        uVar3 = uVar3 | 0x8000;
      }
      else {
        uVar3 = uVar3 & 0xffff7fff;
      }
      *(uint *)&(data->state).field_0x6d0 = uVar3;
    }
    pFVar2->transfer = PPTRANSFER_BODY;
    pFVar2->downloadsize = 0;
    (conn->proto).ftpc.known_filesize = -1;
    return CURLE_OK;
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

static CURLcode ftp_setup_connection(struct Curl_easy *data,
                                     struct connectdata *conn)
{
  char *type;
  struct FTP *ftp;

  data->req.p.ftp = ftp = calloc(sizeof(struct FTP), 1);
  if(!ftp)
    return CURLE_OUT_OF_MEMORY;

  ftp->path = &data->state.up.path[1]; /* don't include the initial slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
      data->state.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->state.list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->state.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->transfer = PPTRANSFER_BODY;
  ftp->downloadsize = 0;
  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}